

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLFileData.h
# Opt level: O0

void __thiscall
Assimp::MDL::IntSplitGroupData_MDL7::~IntSplitGroupData_MDL7(IntSplitGroupData_MDL7 *this)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  size_type sVar1;
  uint local_14;
  uint m;
  IntSplitGroupData_MDL7 *this_local;
  
  if (this->aiSplit != (vector<unsigned_int,_std::allocator<unsigned_int>_> **)0x0) {
    for (local_14 = 0;
        sVar1 = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::size
                          (&this->shared->pcMats), local_14 < sVar1; local_14 = local_14 + 1) {
      this_00 = this->aiSplit[local_14];
      if (this_00 != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(this_00);
        operator_delete(this_00,0x18);
      }
    }
    if (this->aiSplit != (vector<unsigned_int,_std::allocator<unsigned_int>_> **)0x0) {
      operator_delete__(this->aiSplit);
    }
  }
  return;
}

Assistant:

~IntSplitGroupData_MDL7()
    {
        // kill all face lists
        if(this->aiSplit)
        {
            for (unsigned int m = 0; m < shared.pcMats.size();++m)
                delete this->aiSplit[m];
            delete[] this->aiSplit;
        }
    }